

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

int32_t __thiscall
icu_63::Calendar::newestStamp
          (Calendar *this,UCalendarDateFields first,UCalendarDateFields last,int32_t bestStampSoFar)

{
  UCalendarDateFields local_24;
  int local_20;
  int32_t i;
  int32_t bestStamp;
  int32_t bestStampSoFar_local;
  UCalendarDateFields last_local;
  UCalendarDateFields first_local;
  Calendar *this_local;
  
  local_20 = bestStampSoFar;
  for (local_24 = first; (int)local_24 <= (int)last; local_24 = local_24 + UCAL_YEAR) {
    if (local_20 < this->fStamp[(int)local_24]) {
      local_20 = this->fStamp[(int)local_24];
    }
  }
  return local_20;
}

Assistant:

int32_t Calendar::newestStamp(UCalendarDateFields first, UCalendarDateFields last, int32_t bestStampSoFar) const
{
    int32_t bestStamp = bestStampSoFar;
    for (int32_t i=(int32_t)first; i<=(int32_t)last; ++i) {
        if (fStamp[i] > bestStamp) {
            bestStamp = fStamp[i];
        }
    }
    return bestStamp;
}